

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int refineBySim2_init(saucy *s,coloring *c)

{
  int iVar1;
  int *__ptr;
  int *__ptr_00;
  Vec_Int_t *randVec;
  saucy_graph *__ptr_01;
  int who;
  int iVar2;
  Vec_Int_t **in_stack_ffffffffffffffb0;
  
  iVar2 = 0;
  while( true ) {
    if (NUM_SIM2_ITERATION <= iVar2) {
      return 1;
    }
    randVec = assignRandomBitsToCells(s->pNtk,c);
    __ptr_01 = buildSim2Graph(s->pNtk,c,randVec,s->iDep,(Vec_Int_t **)s->topOrder,
                              (Vec_Ptr_t **)s->obs,s->ctrl,in_stack_ffffffffffffffb0);
    if (__ptr_01 == (saucy_graph *)0x0) break;
    __ptr = __ptr_01->adj;
    s->adj = __ptr;
    __ptr_00 = __ptr_01->edg;
    s->edg = __ptr_00;
    iVar1 = s->nsplits;
    for (who = 0; who < s->n; who = who + c->clen[who] + 1) {
      add_induce(s,c,who);
    }
    refine(s,c);
    if (iVar1 < s->nsplits) {
      for (iVar2 = 0; iVar2 < s->n; iVar2 = iVar2 + c->clen[iVar2] + 1) {
        add_induce(s,c,iVar2);
      }
      refineByDepGraph(s,c);
      iVar2 = 0;
    }
    Vec_IntFree(randVec);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    iVar2 = iVar2 + 1;
  }
  __assert_fail("g != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                ,0x562,"int refineBySim2_init(struct saucy *, struct coloring *)");
}

Assistant:

static int
refineBySim2_init(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;    
    int i, j;
    int nsplits;    
    
    for (i = 0; i < NUM_SIM2_ITERATION; i++) {
        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim2Graph(s->pNtk, c, randVec, s->iDep, s->oDep, s->topOrder, s->obs,  s->ctrl);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;
        
        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {                     
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        
        Vec_IntFree(randVec);
        
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    return 1;
}